

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

pool_ref<soul::AST::Function> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Function>
          (RewritingASTVisitor *this,pool_ref<soul::AST::Function> *o)

{
  bool bVar1;
  ASTObject *object;
  undefined8 *in_RDX;
  
  object = visitObject((RewritingASTVisitor *)o,(ASTObject *)*in_RDX);
  bVar1 = is_type<soul::AST::Function,soul::AST::ASTObject>(object);
  if (bVar1) {
    this->_vptr_RewritingASTVisitor = (_func_int **)object;
    return (pool_ref<soul::AST::Function>)(Function *)this;
  }
  throwInternalCompilerError("is_type<Type> (result)","visitAs",0x1d5);
}

Assistant:

pool_ref<Type> visitAs (pool_ref<Type> o)
    {
        auto& result = visitObject (o.getReference());
        SOUL_ASSERT (is_type<Type> (result));
        return static_cast<Type&> (result);
    }